

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O3

CURLcode Curl_follow(Curl_easy *data,char *newurl,followtype type)

{
  char *pcVar1;
  char cVar2;
  long lVar3;
  long lVar4;
  byte bVar5;
  int iVar6;
  char *sep;
  char *pcVar7;
  size_t sVar8;
  char *pcVar9;
  char *pcVar10;
  size_t __n;
  char *pcVar11;
  _Bool relative;
  char cVar12;
  undefined8 unaff_R13;
  ulong uVar13;
  char letter;
  char prot [16];
  undefined1 local_61;
  char *local_60;
  uint local_58;
  followtype local_54;
  char *local_50;
  undefined1 local_48 [24];
  
  if (type == FOLLOW_REDIR) {
    lVar3 = (data->set).followlocation;
    lVar4 = (data->set).maxredirs;
    if (lVar3 < lVar4 || lVar4 == -1) {
      (data->state).this_is_a_follow = true;
      (data->set).followlocation = lVar3 + 1;
      type = FOLLOW_REDIR;
      if ((data->set).http_auto_referer == true) {
        if ((data->change).referer_alloc == true) {
          (*Curl_cfree)((data->change).referer);
          (data->change).referer = (char *)0x0;
          (data->change).referer_alloc = false;
        }
        pcVar7 = (*Curl_cstrdup)((data->change).url);
        (data->change).referer = pcVar7;
        if (pcVar7 == (char *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        (data->change).referer_alloc = true;
      }
      goto LAB_00123a8a;
    }
    type = FOLLOW_FAKE;
    uVar13 = CONCAT71((int7)((ulong)unaff_R13 >> 8),1);
  }
  else {
LAB_00123a8a:
    uVar13 = 0;
  }
  iVar6 = __isoc99_sscanf(newurl,"%15[^?&/:]://%c",local_48,&local_61);
  if (iVar6 == 2) {
    sVar8 = strlen_url(newurl,false);
    pcVar9 = (char *)(*Curl_cmalloc)(sVar8 + 1);
    if (pcVar9 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    strcpy_url(pcVar9,newurl,false);
    if (type == FOLLOW_FAKE) goto LAB_00123d3f;
    (data->state).allow_port = false;
  }
  else {
    local_50 = (*Curl_cstrdup)((data->change).url);
    if (local_50 == (char *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    pcVar9 = strstr(local_50,"//");
    pcVar7 = pcVar9 + 2;
    if (pcVar9 == (char *)0x0) {
      pcVar7 = local_50;
    }
    cVar2 = *newurl;
    local_58 = (uint)uVar13;
    local_54 = type;
    if (cVar2 == '/') {
      local_60 = pcVar7;
      if (newurl[1] == '/') {
        *pcVar7 = '\0';
        newurl = newurl + 2;
        relative = false;
      }
      else {
        pcVar9 = strchr(pcVar7,0x2f);
        pcVar7 = strchr(pcVar7,0x3f);
        if (pcVar9 == (char *)0x0) {
          relative = true;
          if (pcVar7 != (char *)0x0) {
            *pcVar7 = '\0';
          }
        }
        else {
          pcVar10 = pcVar9;
          if (pcVar7 < pcVar9) {
            pcVar10 = pcVar7;
          }
          if (pcVar7 == (char *)0x0) {
            pcVar10 = pcVar9;
          }
          *pcVar10 = '\0';
          relative = true;
        }
      }
    }
    else {
      pcVar9 = strchr(pcVar7,0x3f);
      if (pcVar9 != (char *)0x0) {
        *pcVar9 = '\0';
        cVar2 = *newurl;
      }
      cVar12 = '?';
      if ((cVar2 != '?') && (pcVar9 = strrchr(pcVar7,0x2f), cVar12 = cVar2, pcVar9 != (char *)0x0))
      {
        *pcVar9 = '\0';
        cVar12 = *newurl;
      }
      pcVar10 = strchr(pcVar7,0x2f);
      pcVar7 = pcVar10 + 1;
      pcVar9 = pcVar7;
      if (pcVar10 == (char *)0x0) {
        pcVar9 = (char *)0x0;
      }
      iVar6 = 0;
      if ((cVar12 == '.') && (newurl = newurl + (ulong)(newurl[1] == '/') * 2, *newurl == '.')) {
        iVar6 = 0;
        pcVar11 = newurl;
        do {
          newurl = pcVar11;
          if ((pcVar11[1] != '.') || (pcVar11[2] != '/')) break;
          iVar6 = iVar6 + 1;
          newurl = pcVar11 + 3;
          pcVar1 = pcVar11 + 3;
          pcVar11 = newurl;
        } while (*pcVar1 == '.');
      }
      relative = true;
      local_60 = pcVar7;
      if (pcVar10 == (char *)0x0) {
        local_60 = (char *)0x0;
      }
      else {
        for (; iVar6 != 0; iVar6 = iVar6 + -1) {
          pcVar10 = strrchr(pcVar9,0x2f);
          if (pcVar10 == (char *)0x0) {
            *pcVar9 = '\0';
            local_60 = pcVar7;
            break;
          }
          *pcVar10 = '\0';
          local_60 = pcVar9;
        }
      }
    }
    sVar8 = strlen_url(newurl,relative);
    pcVar7 = local_50;
    __n = strlen(local_50);
    pcVar9 = (char *)(*Curl_cmalloc)(__n + 2 + sVar8);
    if (pcVar9 == (char *)0x0) {
      (*Curl_cfree)(pcVar7);
      return CURLE_OUT_OF_MEMORY;
    }
    memcpy(pcVar9,pcVar7,__n);
    cVar2 = *newurl;
    if (cVar2 != '/') {
      if (local_60 == (char *)0x0) {
        if (cVar2 != '?') goto LAB_00123d0b;
      }
      else if ((cVar2 != '?') && (*local_60 != '\0')) {
LAB_00123d0b:
        pcVar9[__n] = '/';
        __n = __n + 1;
      }
    }
    strcpy_url(pcVar9 + __n,newurl,relative);
    (*Curl_cfree)(local_50);
    uVar13 = (ulong)local_58;
    if (local_54 == FOLLOW_FAKE) {
LAB_00123d3f:
      (data->info).wouldredirect = pcVar9;
      if ((char)uVar13 != '\0') {
        Curl_failf(data,"Maximum (%ld) redirects followed",(data->set).maxredirs);
        return CURLE_TOO_MANY_REDIRECTS;
      }
      return CURLE_OK;
    }
  }
  if ((data->change).url_alloc == true) {
    (*Curl_cfree)((data->change).url);
  }
  (data->change).url = pcVar9;
  (data->change).url_alloc = true;
  Curl_infof(data,"Issue another request to this URL: \'%s\'\n",pcVar9);
  iVar6 = (data->info).httpcode;
  if (iVar6 == 0x12f) {
    if (((data->set).httpreq != HTTPREQ_GET) && (((data->set).keep_post & 4) == 0)) {
      (data->set).httpreq = HTTPREQ_GET;
      pcVar7 = "GET";
      if ((data->set).opt_no_body != false) {
        pcVar7 = "HEAD";
      }
      Curl_infof(data,"Disables POST, goes with %s\n",pcVar7);
    }
  }
  else {
    if (iVar6 == 0x12e) {
      if (2 < (data->set).httpreq - HTTPREQ_POST) goto LAB_00123e7d;
      bVar5 = (byte)(data->set).keep_post & 2;
    }
    else {
      if ((iVar6 != 0x12d) || (2 < (data->set).httpreq - HTTPREQ_POST)) goto LAB_00123e7d;
      bVar5 = (byte)(data->set).keep_post & 1;
    }
    if (bVar5 == 0) {
      Curl_infof(data,"Switch from POST to GET\n");
      (data->set).httpreq = HTTPREQ_GET;
    }
  }
LAB_00123e7d:
  Curl_pgrsTime(data,TIMER_REDIRECT);
  Curl_pgrsResetTransferSizes(data);
  return CURLE_OK;
}

Assistant:

CURLcode Curl_follow(struct Curl_easy *data,
                     char *newurl,    /* the Location: string */
                     followtype type) /* see transfer.h */
{
#ifdef CURL_DISABLE_HTTP
  (void)data;
  (void)newurl;
  (void)type;
  /* Location: following will not happen when HTTP is disabled */
  return CURLE_TOO_MANY_REDIRECTS;
#else

  /* Location: redirect */
  bool disallowport = FALSE;
  bool reachedmax = FALSE;

  if(type == FOLLOW_REDIR) {
    if((data->set.maxredirs != -1) &&
       (data->set.followlocation >= data->set.maxredirs)) {
      reachedmax = TRUE;
      type = FOLLOW_FAKE; /* switch to fake to store the would-be-redirected
                             to URL */
    }
    else {
      /* mark the next request as a followed location: */
      data->state.this_is_a_follow = TRUE;

      data->set.followlocation++; /* count location-followers */

      if(data->set.http_auto_referer) {
        /* We are asked to automatically set the previous URL as the referer
           when we get the next URL. We pick the ->url field, which may or may
           not be 100% correct */

        if(data->change.referer_alloc) {
          Curl_safefree(data->change.referer);
          data->change.referer_alloc = FALSE;
        }

        data->change.referer = strdup(data->change.url);
        if(!data->change.referer)
          return CURLE_OUT_OF_MEMORY;
        data->change.referer_alloc = TRUE; /* yes, free this later */
      }
    }
  }

  if(!is_absolute_url(newurl)) {
    /***
     *DANG* this is an RFC 2068 violation. The URL is supposed
     to be absolute and this doesn't seem to be that!
     */
    char *absolute = concat_url(data->change.url, newurl);
    if(!absolute)
      return CURLE_OUT_OF_MEMORY;
    newurl = absolute;
  }
  else {
    /* The new URL MAY contain space or high byte values, that means a mighty
       stupid redirect URL but we still make an effort to do "right". */
    char *newest;
    size_t newlen = strlen_url(newurl, FALSE);

    /* This is an absolute URL, don't allow the custom port number */
    disallowport = TRUE;

    newest = malloc(newlen + 1); /* get memory for this */
    if(!newest)
      return CURLE_OUT_OF_MEMORY;

    strcpy_url(newest, newurl, FALSE); /* create a space-free URL */
    newurl = newest; /* use this instead now */

  }

  if(type == FOLLOW_FAKE) {
    /* we're only figuring out the new url if we would've followed locations
       but now we're done so we can get out! */
    data->info.wouldredirect = newurl;

    if(reachedmax) {
      failf(data, "Maximum (%ld) redirects followed", data->set.maxredirs);
      return CURLE_TOO_MANY_REDIRECTS;
    }
    return CURLE_OK;
  }

  if(disallowport)
    data->state.allow_port = FALSE;

  if(data->change.url_alloc) {
    Curl_safefree(data->change.url);
    data->change.url_alloc = FALSE;
  }

  data->change.url = newurl;
  data->change.url_alloc = TRUE;

  infof(data, "Issue another request to this URL: '%s'\n", data->change.url);

  /*
   * We get here when the HTTP code is 300-399 (and 401). We need to perform
   * differently based on exactly what return code there was.
   *
   * News from 7.10.6: we can also get here on a 401 or 407, in case we act on
   * a HTTP (proxy-) authentication scheme other than Basic.
   */
  switch(data->info.httpcode) {
    /* 401 - Act on a WWW-Authenticate, we keep on moving and do the
       Authorization: XXXX header in the HTTP request code snippet */
    /* 407 - Act on a Proxy-Authenticate, we keep on moving and do the
       Proxy-Authorization: XXXX header in the HTTP request code snippet */
    /* 300 - Multiple Choices */
    /* 306 - Not used */
    /* 307 - Temporary Redirect */
  default:  /* for all above (and the unknown ones) */
    /* Some codes are explicitly mentioned since I've checked RFC2616 and they
     * seem to be OK to POST to.
     */
    break;
  case 301: /* Moved Permanently */
    /* (quote from RFC7231, section 6.4.2)
     *
     * Note: For historical reasons, a user agent MAY change the request
     * method from POST to GET for the subsequent request.  If this
     * behavior is undesired, the 307 (Temporary Redirect) status code
     * can be used instead.
     *
     * ----
     *
     * Many webservers expect this, so these servers often answers to a POST
     * request with an error page. To be sure that libcurl gets the page that
     * most user agents would get, libcurl has to force GET.
     *
     * This behaviour is forbidden by RFC1945 and the obsolete RFC2616, and
     * can be overridden with CURLOPT_POSTREDIR.
     */
    if((data->set.httpreq == HTTPREQ_POST
        || data->set.httpreq == HTTPREQ_POST_FORM
        || data->set.httpreq == HTTPREQ_POST_MIME)
       && !(data->set.keep_post & CURL_REDIR_POST_301)) {
      infof(data, "Switch from POST to GET\n");
      data->set.httpreq = HTTPREQ_GET;
    }
    break;
  case 302: /* Found */
    /* (quote from RFC7231, section 6.4.3)
     *
     * Note: For historical reasons, a user agent MAY change the request
     * method from POST to GET for the subsequent request.  If this
     * behavior is undesired, the 307 (Temporary Redirect) status code
     * can be used instead.
     *
     * ----
     *
     * Many webservers expect this, so these servers often answers to a POST
     * request with an error page. To be sure that libcurl gets the page that
     * most user agents would get, libcurl has to force GET.
     *
     * This behaviour is forbidden by RFC1945 and the obsolete RFC2616, and
     * can be overridden with CURLOPT_POSTREDIR.
     */
    if((data->set.httpreq == HTTPREQ_POST
        || data->set.httpreq == HTTPREQ_POST_FORM
        || data->set.httpreq == HTTPREQ_POST_MIME)
       && !(data->set.keep_post & CURL_REDIR_POST_302)) {
      infof(data, "Switch from POST to GET\n");
      data->set.httpreq = HTTPREQ_GET;
    }
    break;

  case 303: /* See Other */
    /* Disable both types of POSTs, unless the user explicitly
       asks for POST after POST */
    if(data->set.httpreq != HTTPREQ_GET
      && !(data->set.keep_post & CURL_REDIR_POST_303)) {
      data->set.httpreq = HTTPREQ_GET; /* enforce GET request */
      infof(data, "Disables POST, goes with %s\n",
            data->set.opt_no_body?"HEAD":"GET");
    }
    break;
  case 304: /* Not Modified */
    /* 304 means we did a conditional request and it was "Not modified".
     * We shouldn't get any Location: header in this response!
     */
    break;
  case 305: /* Use Proxy */
    /* (quote from RFC2616, section 10.3.6):
     * "The requested resource MUST be accessed through the proxy given
     * by the Location field. The Location field gives the URI of the
     * proxy.  The recipient is expected to repeat this single request
     * via the proxy. 305 responses MUST only be generated by origin
     * servers."
     */
    break;
  }
  Curl_pgrsTime(data, TIMER_REDIRECT);
  Curl_pgrsResetTransferSizes(data);

  return CURLE_OK;
#endif /* CURL_DISABLE_HTTP */
}